

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O0

void __thiscall FZFile::gen_outline(FZFile *this)

{
  pointer pBVar1;
  value_type *__x;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  long in_RDI;
  int maxy;
  int miny;
  int maxx;
  int minx;
  vector<BRDPin,_std::allocator<BRDPin>_> *in_stack_ffffffffffffff18;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *in_stack_ffffffffffffff20;
  BRDPoint local_b4;
  BRDPoint local_ac;
  BRDPoint local_a4;
  BRDPoint local_9c;
  BRDPoint local_94;
  BRDPin *local_88;
  BRDPin *local_80;
  __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_> local_78;
  int local_70;
  BRDPin *local_68;
  BRDPin *local_60;
  __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_> local_58;
  int local_50;
  BRDPin *local_48;
  BRDPin *local_40;
  __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_> local_38;
  int local_30;
  BRDPin *local_28;
  BRDPin *local_20;
  __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_> local_18;
  int local_c;
  
  local_20 = (BRDPin *)
             std::vector<BRDPin,_std::allocator<BRDPin>_>::begin(in_stack_ffffffffffffff18);
  local_28 = (BRDPin *)std::vector<BRDPin,_std::allocator<BRDPin>_>::end(in_stack_ffffffffffffff18);
  local_18 = std::
             min_element<__gnu_cxx::__normal_iterator<BRDPin*,std::vector<BRDPin,std::allocator<BRDPin>>>,FZFile::gen_outline()::__0>
                       (local_20,local_28);
  pBVar1 = __gnu_cxx::__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
           operator->(&local_18);
  local_c = (pBVar1->pos).x + -0x14;
  local_40 = (BRDPin *)
             std::vector<BRDPin,_std::allocator<BRDPin>_>::begin(in_stack_ffffffffffffff18);
  local_48 = (BRDPin *)std::vector<BRDPin,_std::allocator<BRDPin>_>::end(in_stack_ffffffffffffff18);
  local_38 = std::
             max_element<__gnu_cxx::__normal_iterator<BRDPin*,std::vector<BRDPin,std::allocator<BRDPin>>>,FZFile::gen_outline()::__1>
                       (local_40,local_48);
  pBVar1 = __gnu_cxx::__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
           operator->(&local_38);
  local_30 = (pBVar1->pos).x + 0x14;
  local_60 = (BRDPin *)
             std::vector<BRDPin,_std::allocator<BRDPin>_>::begin(in_stack_ffffffffffffff18);
  local_68 = (BRDPin *)std::vector<BRDPin,_std::allocator<BRDPin>_>::end(in_stack_ffffffffffffff18);
  local_58 = std::
             min_element<__gnu_cxx::__normal_iterator<BRDPin*,std::vector<BRDPin,std::allocator<BRDPin>>>,FZFile::gen_outline()::__2>
                       (local_60,local_68);
  pBVar1 = __gnu_cxx::__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
           operator->(&local_58);
  local_50 = (pBVar1->pos).y + -0x14;
  local_80 = (BRDPin *)
             std::vector<BRDPin,_std::allocator<BRDPin>_>::begin(in_stack_ffffffffffffff18);
  local_88 = (BRDPin *)std::vector<BRDPin,_std::allocator<BRDPin>_>::end(in_stack_ffffffffffffff18);
  local_78 = std::
             max_element<__gnu_cxx::__normal_iterator<BRDPin*,std::vector<BRDPin,std::allocator<BRDPin>>>,FZFile::gen_outline()::__3>
                       (local_80,local_88);
  pBVar1 = __gnu_cxx::__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
           operator->(&local_78);
  local_70 = (pBVar1->pos).y + 0x14;
  __x = (value_type *)(in_RDI + 0x18);
  BRDPoint::BRDPoint(&local_94,local_c,local_50);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(in_stack_ffffffffffffff20,__x);
  this_00 = (vector<BRDPoint,_std::allocator<BRDPoint>_> *)(in_RDI + 0x18);
  BRDPoint::BRDPoint(&local_9c,local_30,local_50);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(this_00,__x);
  BRDPoint::BRDPoint(&local_a4,local_30,local_70);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(this_00,__x);
  BRDPoint::BRDPoint(&local_ac,local_c,local_70);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(this_00,__x);
  BRDPoint::BRDPoint(&local_b4,local_c,local_50);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(this_00,__x);
  return;
}

Assistant:

void FZFile::gen_outline() {
	// Determine board outline
	int minx =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x - OUTLINE_MARGIN;
	int maxx =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x + OUTLINE_MARGIN;
	int miny =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y - OUTLINE_MARGIN;
	int maxy =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y + OUTLINE_MARGIN;
	format.push_back({minx, miny});
	format.push_back({maxx, miny});
	format.push_back({maxx, maxy});
	format.push_back({minx, maxy});
	format.push_back({minx, miny});
}